

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O3

void __thiscall
Database::update_iterator
          (Database *this,DatabaseName *name,uint64_t byte_offset,uint64_t file_offset)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  *this_00;
  source_loc loc;
  iterator iVar1;
  logger *this_01;
  string *__k;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  pVar2;
  string_view_t fmt;
  
  this_00 = &this->iterators;
  __k = &name->id;
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
          ::find(&this_00->_M_t,__k);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->iterators)._M_t._M_impl.super__Rb_tree_header) {
    this_01 = spdlog::default_logger_raw();
    loc.funcname = (char *)0x0;
    loc.filename = (char *)0x0;
    loc.line = 0;
    loc._12_4_ = 0;
    fmt.size_ = 0x20;
    fmt.data_ = "Can\'t update invalid iterator {}";
    spdlog::logger::log<std::__cxx11::string>(this_01,loc,warn,fmt,__k);
    return;
  }
  if (file_offset < *(ulong *)(iVar1._M_node + 0xc)) {
    iVar1._M_node[0xc]._M_parent = (_Base_ptr)byte_offset;
    iVar1._M_node[0xc]._M_left = (_Base_ptr)file_offset;
    OnDiskIterator::save((OnDiskIterator *)(iVar1._M_node + 2));
    return;
  }
  OnDiskIterator::drop((OnDiskIterator *)(iVar1._M_node + 2));
  pVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
          ::equal_range(&this_00->_M_t,__k);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar2.first._M_node,(_Base_ptr)pVar2.second._M_node);
  return;
}

Assistant:

void Database::update_iterator(const DatabaseName &name, uint64_t byte_offset,
                               uint64_t file_offset) {
    auto it = iterators.find(name.get_id());
    if (it == iterators.end()) {
        spdlog::warn("Can't update invalid iterator {}", name.get_id());
        return;
    }
    OnDiskIterator &iter = it->second;
    if (file_offset >= iter.get_total_files()) {
        iter.drop();
        iterators.erase(name.get_id());
    } else {
        iter.update_offset(byte_offset, file_offset);
        iter.save();
    }
}